

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_shf_df_mips(CPUMIPSState *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t imm)

{
  uint local_4c;
  uint32_t i;
  wr_t *pwx;
  wr_t wx;
  wr_t *pws;
  wr_t *pwd;
  uint32_t imm_local;
  uint32_t ws_local;
  uint32_t wd_local;
  uint32_t df_local;
  CPUMIPSState *env_local;
  
  pws = (wr_t *)((env->active_fpu).fpr + wd);
  wx.d[1] = (int64_t)((env->active_fpu).fpr + ws);
  pwd._0_4_ = imm;
  pwd._4_4_ = ws;
  imm_local = wd;
  ws_local = df;
  _wd_local = env;
  if (df == 0) {
    for (local_4c = 0; local_4c < 0x10; local_4c = local_4c + 1) {
      ((wr_t *)&pwx)->b[local_4c] =
           *(int8_t *)
            (wx.d[1] + (ulong)((local_4c & 0xfc) + (imm >> (sbyte)((local_4c & 3) << 1) & 3)));
    }
  }
  else if (df == 1) {
    for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
      ((wr_t *)&pwx)->h[local_4c] =
           *(int16_t *)
            (wx.d[1] + (ulong)((local_4c & 0xfc) + (imm >> (sbyte)((local_4c & 3) << 1) & 3)) * 2);
    }
  }
  else {
    if (df != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1136,
                    "void helper_msa_shf_df_mips(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
      ((wr_t *)&pwx)->w[local_4c] =
           *(float32 *)
            (wx.d[1] + (ulong)((local_4c & 0xfc) + (imm >> (sbyte)((local_4c & 3) << 1) & 3)) * 4);
    }
  }
  msa_move_v(pws,(wr_t *)&pwx);
  return;
}

Assistant:

void helper_msa_shf_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                       uint32_t ws, uint32_t imm)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t wx, *pwx = &wx;
    uint32_t i;

    switch (df) {
    case DF_BYTE:
        for (i = 0; i < DF_ELEMENTS(DF_BYTE); i++) {
            pwx->b[i] = pws->b[SHF_POS(i, imm)];
        }
        break;
    case DF_HALF:
        for (i = 0; i < DF_ELEMENTS(DF_HALF); i++) {
            pwx->h[i] = pws->h[SHF_POS(i, imm)];
        }
        break;
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            pwx->w[i] = pws->w[SHF_POS(i, imm)];
        }
        break;
    default:
        assert(0);
    }
    msa_move_v(pwd, pwx);
}